

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int entropy_gather_internal(mbedtls_entropy_context *ctx)

{
  int iVar1;
  size_t local_b0;
  size_t olen;
  uchar buf [128];
  int local_20;
  int have_one_strong;
  int i;
  int ret;
  mbedtls_entropy_context *ctx_local;
  
  have_one_strong = -0x3c;
  buf[0x7c] = '\0';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  if (ctx->source_count == 0) {
    ctx_local._4_4_ = -0x40;
  }
  else {
    for (local_20 = 0; local_20 < ctx->source_count; local_20 = local_20 + 1) {
      if (ctx->source[local_20].strong == 1) {
        buf[0x7c] = '\x01';
        buf[0x7d] = '\0';
        buf[0x7e] = '\0';
        buf[0x7f] = '\0';
      }
      local_b0 = 0;
      have_one_strong =
           (*ctx->source[local_20].f_source)
                     (ctx->source[local_20].p_source,(uchar *)&olen,0x80,&local_b0);
      if (have_one_strong != 0) goto LAB_0010f0d8;
      if (local_b0 != 0) {
        iVar1 = entropy_update(ctx,(uchar)local_20,(uchar *)&olen,local_b0);
        if (iVar1 != 0) {
          return iVar1;
        }
        ctx->source[local_20].size = local_b0 + ctx->source[local_20].size;
        have_one_strong = 0;
      }
    }
    if (buf._124_4_ == 0) {
      have_one_strong = -0x3d;
    }
LAB_0010f0d8:
    mbedtls_platform_zeroize(&olen,0x80);
    ctx_local._4_4_ = have_one_strong;
  }
  return ctx_local._4_4_;
}

Assistant:

static int entropy_gather_internal( mbedtls_entropy_context *ctx )
{
    int ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
    int i;
    int have_one_strong = 0;
    unsigned char buf[MBEDTLS_ENTROPY_MAX_GATHER];
    size_t olen;

    if( ctx->source_count == 0 )
        return( MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED );

    /*
     * Run through our entropy sources
     */
    for( i = 0; i < ctx->source_count; i++ )
    {
        if( ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG )
            have_one_strong = 1;

        olen = 0;
        if( ( ret = ctx->source[i].f_source( ctx->source[i].p_source,
                        buf, MBEDTLS_ENTROPY_MAX_GATHER, &olen ) ) != 0 )
        {
            goto cleanup;
        }

        /*
         * Add if we actually gathered something
         */
        if( olen > 0 )
        {
            if( ( ret = entropy_update( ctx, (unsigned char) i,
                                        buf, olen ) ) != 0 )
                return( ret );
            ctx->source[i].size += olen;
        }
    }

    if( have_one_strong == 0 )
        ret = MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE;

cleanup:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( ret );
}